

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator * __thiscall
QMultiHash<RCCFileInfo::DeduplicationKey,RCCFileInfo*>::emplace<RCCFileInfo*const&>
          (QMultiHash<RCCFileInfo::DeduplicationKey,_RCCFileInfo_*> *this,DeduplicationKey *key,
          RCCFileInfo **args)

{
  DeduplicationKey *in_RCX;
  QMultiHash<RCCFileInfo::DeduplicationKey,_RCCFileInfo_*> *in_RDX;
  DeduplicationKey *in_RDI;
  long in_FS_OFFSET;
  RCCFileInfo **args_00;
  RCCFileInfo *local_30 [5];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  args_00 = local_30;
  RCCFileInfo::DeduplicationKey::DeduplicationKey(in_RDI,in_RDI);
  emplace<RCCFileInfo*const&>(in_RDX,in_RCX,args_00);
  RCCFileInfo::DeduplicationKey::~DeduplicationKey((DeduplicationKey *)0x12453f);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(const Key &key, Args &&... args)
    {
        return emplace(Key(key), std::forward<Args>(args)...);
    }